

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::BlenderImporter::CanRead
          (BlenderImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  string local_40;
  
  BaseImporter::GetExtension(&local_40,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar2 == 0) {
    bVar1 = true;
    goto LAB_004ca2eb;
  }
  if (local_40._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_004ca2c2;
  }
  else if (pIOHandler != (IOSystem *)0x0 && checkSig) {
LAB_004ca2c2:
    bVar1 = BaseImporter::SearchFileHeaderForToken
                      (pIOHandler,pFile,TokensForSearch,1,200,false,false);
    goto LAB_004ca2eb;
  }
  bVar1 = false;
LAB_004ca2eb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool BlenderImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string& extension = GetExtension(pFile);
    if (extension == "blend") {
        return true;
    }

    else if ((!extension.length() || checkSig) && pIOHandler)   {
        // note: this won't catch compressed files
        return SearchFileHeaderForToken(pIOHandler,pFile, TokensForSearch,1);
    }
    return false;
}